

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chrono.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  vector<double,_std::allocator<double>_> v;
  string output_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  vector<double,_std::allocator<double>_> v2;
  string mkdir_command;
  ifstream f;
  ofstream timings;
  ofstream output_file;
  vector<double,_std::allocator<double>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6f8;
  vector<double,_std::allocator<double>_> local_6d8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650 [16];
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_448;
  undefined1 local_430 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [14];
  ios_base aiStack_338 [264];
  pointer local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_650[0].field_2;
  local_650[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"../data/0_rse_workshop.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_6f8,
             local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_650[0]._M_dataplus._M_p,local_650[0].field_2._M_allocated_capacity + 1);
  }
  local_650[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"../data/1_rse_workshop.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_6f8,
             local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_650[0]._M_dataplus._M_p,local_650[0].field_2._M_allocated_capacity + 1);
  }
  local_650[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"../data/2_rse_workshop.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_6f8,
             local_650);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_650[0]._M_dataplus._M_p,local_650[0].field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream
            (local_650,
             (string *)
             local_6f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,_S_in);
  local_668._M_ok = true;
  local_668._M_stream = (istream_type *)local_650;
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_668);
  local_448._M_stream = (istream_type *)0x0;
  local_448._M_value = 0.0;
  local_448._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&local_730,&local_668,&local_448,
             (allocator_type *)&local_230);
  lVar5 = std::chrono::_V2::system_clock::now();
  lVar11 = (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  dVar14 = 0.0;
  if (local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar10 = 0;
    dVar14 = 0.0;
    do {
      dVar14 = dVar14 + local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
  }
  lVar10 = std::chrono::_V2::system_clock::now();
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar7 = (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar13 = 0.0;
  if (local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar12 = 0;
    do {
      dVar13 = dVar13 + local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12] *
                        local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar12);
  }
  dVar14 = dVar13 / (double)lVar7 - (dVar14 / (double)lVar11) * (dVar14 / (double)lVar11);
  lVar11 = std::chrono::_V2::system_clock::now();
  if (dVar14 < 0.0) {
    sqrt(dVar14);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_6d8,&local_730);
  local_690 = lVar11;
  local_698 = std::chrono::_V2::system_clock::now();
  pdVar4 = local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar11 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar4,local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  lVar11 = std::chrono::_V2::system_clock::now();
  local_6a8 = std::chrono::_V2::system_clock::now();
  local_6b0 = std::chrono::_V2::system_clock::now();
  lVar7 = std::chrono::_V2::system_clock::now();
  lVar12 = std::chrono::_V2::system_clock::now();
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"./output","");
  std::operator+(&local_688,"mkdir -p ",&local_718);
  local_6b8 = lVar12;
  system(local_688._M_dataplus._M_p);
  lVar12 = std::chrono::_V2::system_clock::now();
  local_430._0_8_ = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_430,local_718._M_dataplus._M_p,
             local_718._M_dataplus._M_p + local_718._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
             "/results.dat");
  local_6a0 = lVar10;
  std::ofstream::ofstream(&local_230,(string *)local_430,_S_out);
  local_6c0 = lVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != local_420) {
    operator_delete((void *)local_430._0_8_,local_420[0]._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<double>
            (*local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  if (8 < (ulong)((long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    uVar8 = 1;
    do {
      local_430[0] = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_430,1);
      std::ostream::_M_insert<double>
                (local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_730.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_730.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  lVar10 = std::chrono::_V2::system_clock::now();
  std::ofstream::ofstream(local_430,"timings_0.csv",_S_app);
  *(uint *)((long)local_420 + *(long *)(local_430._0_8_ + -0x18) + 8) =
       *(uint *)((long)local_420 + *(long *)(local_430._0_8_ + -0x18) + 8) & 0xfffffefb | 4;
  poVar9 = std::ostream::_M_insert<double>((double)(lVar10 - lVar12) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<double>((double)(local_6a0 - lVar5) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<double>((double)(local_690 - lVar6) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<double>((double)(lVar11 - local_698) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<double>((double)(local_6b0 - local_6a8) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<double>((double)(local_6b8 - local_6c0) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ofstream::close();
  uVar3 = _memcpy;
  pcVar2 = _VTT;
  local_430._0_8_ = _VTT;
  *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_430 + 8));
  std::ios_base::~ios_base(aiStack_338);
  local_230 = pcVar2;
  *(undefined8 *)(local_228 + *(long *)(pcVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if (local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_730.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_650);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6f8);
  return 0;
}

Assistant:

int main()
{
  // Declare start and end points for timings with chrono
  std::chrono::high_resolution_clock::time_point t1;
  std::chrono::high_resolution_clock::time_point t2;
  
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find some pre-prepared data files
    std::vector<std::string> data_files;
    data_files.push_back("../data/0_rse_workshop.dat");
    data_files.push_back("../data/1_rse_workshop.dat");
    data_files.push_back("../data/2_rse_workshop.dat");


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    // Compute mean
    t1 = std::chrono::high_resolution_clock::now();
    double sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i];
    }
    const double mean = sum / v.size();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> reduce = t2 - t1;
    
    // Compute standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i] * v[i];
    }
    const double var = sum / v.size() - mean * mean;
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> transform_reduce = t2 - t1;
    
    // Compute variance
    const double std = std::sqrt(var);

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    sum = 0.0;
    double one_over_sigma3 = 1.0 / (std * std * std);
    for (int i = 0; i < v.size(); i++)
    {
        sum += (v[i] - mean) * (v[i] - mean) * (v[i] - mean) * one_over_sigma3;
    }
    const double skew = sum / v.size();

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;
    t1 = std::chrono::high_resolution_clock::now();
    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> nth_element = t2 - t1;
    
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    t1 = std::chrono::high_resolution_clock::now();
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> any_of = t2 - t1;

    // First position where consecutive elements differ by more than twice the standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> mismatch = t2 - t1;

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> writeData = t2 - t1;

    ////////////////////////////////////////////////////////////////////////////////

        ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// Writing timings to csv file checkpoint_xx/timings.csv
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    std::ofstream timings("timings_0.csv", std::ios::app);
    timings << std::fixed << writeData.count() << ", "
	    << reduce.count() << ", "
	    << transform_reduce.count() << ", "
	    << nth_element.count() << ", "
	    << any_of.count() << ", "
	    << mismatch.count() << std::endl;
    timings.close();
}